

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

WeakPtr __thiscall
hwnet::util::TimerRoutine::
addTimerOnce<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPConnector>),std::shared_ptr<hwnet::TCPConnector>&>
          (TimerRoutine *this,milliseconds timeout,
          _func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPConnector> *callback,
          shared_ptr<hwnet::TCPConnector> *args)

{
  TimerRoutine *pTVar1;
  Timer *this_00;
  milliseconds mVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2> *in_R8;
  WeakPtr WVar3;
  Callback local_90;
  _Bind<void_(*(std::_Placeholder<1>,_std::shared_ptr<hwnet::TCPConnector>))(const_std::shared_ptr<hwnet::util::Timer>_&,_std::shared_ptr<hwnet::TCPConnector>)>
  local_70;
  _func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPConnector> *local_58;
  TimerRoutine *local_50;
  undefined1 local_48 [8];
  Ptr timer;
  milliseconds timeout_local;
  
  local_50 = this;
  timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)callback;
  this_00 = (Timer *)operator_new(0x78);
  mVar2 = getMilliseconds((TimerRoutine *)timeout);
  local_58 = callback + mVar2;
  local_70._M_f =
       (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPConnector> *)args;
  std::__shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2> *)
             &local_70._M_bound_args,in_R8);
  std::function<void(std::shared_ptr<hwnet::util::Timer>const&)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,std::shared_ptr<hwnet::TCPConnector>))(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPConnector>)>,void>
            ((function<void(std::shared_ptr<hwnet::util::Timer>const&)> *)&local_90,&local_70);
  Timer::Timer(this_00,(milliseconds *)&local_58,
               (milliseconds *)
               &timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,true,&local_90);
  std::__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::util::Timer,void>
            ((__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> *)local_48,this_00);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_70._M_bound_args.
                     super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<hwnet::TCPConnector>_>
                     .super__Tuple_impl<1UL,_std::shared_ptr<hwnet::TCPConnector>_>.
                     super__Head_base<1UL,_std::shared_ptr<hwnet::TCPConnector>,_false>._M_head_impl
             + 8));
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(timeout + 0x18))->__data);
  TimerMgr::insert((TimerMgr *)timeout,(Ptr *)local_48);
  if ((*(char *)(timeout + 0xc0) == '\x01') &&
     (timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(timeout + 0xb8))) {
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(timeout + 0xb8) =
         timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    std::_V2::condition_variable_any::notify_one((condition_variable_any *)(timeout + 0x60));
  }
  pTVar1 = local_50;
  std::__weak_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<hwnet::util::Timer,void>
            ((__weak_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> *)local_50,
             (__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  pthread_mutex_unlock((pthread_mutex_t *)(timeout + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&timer);
  WVar3.super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  WVar3.super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pTVar1;
  return (WeakPtr)WVar3.super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Timer::WeakPtr addTimerOnce(milliseconds timeout, F&& callback, TArgs&& ...args)
    {
        auto timer = Timer::Ptr(new Timer(getMilliseconds() + timeout,timeout,
        	true,std::bind(std::forward<F>(callback), std::placeholders::_1, std::forward<TArgs>(args)...)));

        std::lock_guard<std::mutex> guard(this->mgr.mtx);
        this->mgr.insert(timer);
        if(waitting && timeout < waitTime) {
        	waitTime = timeout;
        	this->cv.notify_one();
        }

        return timer;
    }